

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

bool __thiscall imrt::Collimator::isActiveBeamAngle(Collimator *this,int x,int y,int angle)

{
  mapped_type *pmVar1;
  reference pvVar2;
  int in_EDX;
  int in_ESI;
  map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *in_stack_00000020;
  
  pmVar1 = std::
           map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           ::operator[](in_stack_00000020,(key_type_conflict *)this);
  pvVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     (pmVar1,(long)in_ESI);
  if (pvVar2->first <= in_EDX) {
    pmVar1 = std::
             map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
             ::operator[](in_stack_00000020,(key_type_conflict *)this);
    pvVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (pmVar1,(long)in_ESI);
    if (in_EDX <= pvVar2->second) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Collimator::isActiveBeamAngle(int x, int y, int angle) {
    if (angle_row_beam_active[angle][x].first <= y && angle_row_beam_active[angle][x].second >= y)
      return(true);
    return(false);
  }